

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

bool __thiscall
metal::scatter(metal *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  vec3 p;
  double local_48;
  double local_40;
  double local_38;
  
  dVar7 = (r_in->dir).e[0];
  dVar5 = (r_in->dir).e[1];
  dVar8 = (rec->normal).e[0];
  dVar1 = (rec->normal).e[1];
  dVar6 = (r_in->dir).e[2];
  dVar3 = (rec->normal).e[2];
  dVar4 = dVar6 * dVar3 + dVar7 * dVar8 + dVar5 * dVar1;
  dVar4 = dVar4 + dVar4;
  dVar7 = dVar7 - dVar8 * dVar4;
  dVar5 = dVar5 - dVar1 * dVar4;
  dVar6 = dVar6 - dVar4 * dVar3;
  dVar8 = dVar6 * dVar6 + dVar7 * dVar7 + dVar5 * dVar5;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar1 = this->fuzz;
  vec3::random();
  dVar3 = local_38 * local_38 + local_48 * local_48 + local_40 * local_40;
  while ((dVar3 <= 1e-160 || (1.0 < dVar3))) {
    vec3::random();
    dVar3 = local_38 * local_38 + local_48 * local_48 + local_40 * local_40;
  }
  dVar8 = 1.0 / dVar8;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar3 = 1.0 / dVar3;
  dVar4 = (rec->p).e[0];
  dVar2 = (rec->p).e[1];
  (scattered->orig).e[2] = (rec->p).e[2];
  (scattered->orig).e[0] = dVar4;
  (scattered->orig).e[1] = dVar2;
  (scattered->dir).e[0] = dVar8 * dVar7 + local_48 * dVar3 * dVar1;
  (scattered->dir).e[1] = dVar5 * dVar8 + local_40 * dVar3 * dVar1;
  (scattered->dir).e[2] = dVar6 * dVar8 + dVar3 * local_38 * dVar1;
  attenuation->e[2] = (this->albedo).e[2];
  dVar7 = (this->albedo).e[1];
  attenuation->e[0] = (this->albedo).e[0];
  attenuation->e[1] = dVar7;
  return 0.0 < (scattered->dir).e[2] * (rec->normal).e[2] +
               (scattered->dir).e[0] * (rec->normal).e[0] +
               (scattered->dir).e[1] * (rec->normal).e[1];
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        vec3 reflected = reflect(r_in.direction(), rec.normal);
        reflected = unit_vector(reflected) + (fuzz * random_unit_vector());
        scattered = ray(rec.p, reflected);
        attenuation = albedo;
        return (dot(scattered.direction(), rec.normal) > 0);
    }